

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  pointer pNVar4;
  Var *pVVar5;
  pointer pcVar6;
  uint64_t uVar7;
  Module *pMVar8;
  VarExpr<(wabt::ExprType)26> *ve;
  Func *pFVar9;
  const_iterator cVar10;
  pointer pbVar11;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view postfix_02;
  string_view postfix_03;
  string_view postfix_04;
  ModuleContext *pMVar12;
  pointer pbVar13;
  pointer child;
  Value *__return_storage_ptr___00;
  int iVar14;
  long *plVar15;
  mapped_type *pmVar16;
  Type TVar17;
  undefined8 *puVar18;
  Expr *pEVar19;
  uint *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  size_t sVar21;
  Module *pMVar22;
  Expr *pEVar23;
  char *pcVar24;
  Decompiler *pDVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  undefined8 uVar29;
  char *pcVar30;
  pointer pLVar31;
  _Alloc_hider _Var32;
  Expr *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  Precedence PVar33;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  Node *c;
  pointer n_00;
  ulong uVar34;
  Value *val;
  Var *v;
  Func *pFVar35;
  pointer pbVar36;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool bVar37;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view infix;
  string_view prefix_02;
  string_view infix_00;
  string_view y;
  string_view y_00;
  string_view infix_01;
  string_view prefix_03;
  string_view prefix_04;
  string_view first_indent;
  string_view prefix_05;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view sVar38;
  string decls;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  undefined4 uVar39;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [2];
  string_view local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  Decompiler *local_140;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> local_138;
  Node *local_120;
  string local_118;
  Value *local_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  pointer local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  pNVar4 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_140 = (Decompiler *)parent;
  local_f0 = __return_storage_ptr__;
  if (n_00 != pNVar4) {
    do {
      DecompileExpr((Value *)local_1b8,this,n_00,n);
      std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
      emplace_back<wabt::Decompiler::Value>(&local_138,(Value *)local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      n_00 = n_00 + 1;
    } while (n_00 != pNVar4);
  }
  __return_storage_ptr___00 = local_f0;
  child = local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start;
  args_1 = &switchD_0015b24c::switchdataD_001e5d34;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/decompiler.cc"
                  ,0x19e,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"let ","");
    if ((n->u).field_0.var_count != 0) {
      uVar27 = 0;
      do {
        if (uVar27 != 0) {
          std::__cxx11::string::append(local_1b8);
        }
        TempVarName_abi_cxx11_((string *)&local_168,this,(n->u).field_0.var_start + uVar27);
        std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_len != &local_158) {
          operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (n->u).field_0.var_count);
    }
    std::__cxx11::string::append(local_1b8);
    local_58 = 0;
    pcStack_50 = "";
    postfix._M_str._4_4_ = 0;
    postfix._0_12_ = ZEXT412(0x1e60b3) << 0x40;
    prefix._M_str = (char *)local_1b8._0_8_;
    prefix._M_len = local_1b8._8_8_;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix,postfix,Assign);
    goto LAB_0015b641;
  case FlushedVar:
    TempVarName_abi_cxx11_((string *)local_1b8,this,(n->u).field_0.var_start);
LAB_0015b542:
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
LAB_0015b57e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    goto LAB_0015b641;
  case Statements:
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b8);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    if ((n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar34 = 0;
      do {
        pEVar19 = ((intrusive_list_base<wabt::Expr> *)
                  &((ModuleContext *)
                   &(local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)[uVar34 * 2].
                  next_;
        cVar1 = pEVar19[-1].loc.filename._M_str[pEVar19[-1].loc.field_1.field_1.offset - 1];
        if ((cVar1 != ':') && (cVar1 != '}')) {
          std::__cxx11::string::push_back((char)pEVar19 + -0x20);
        }
        pMVar22 = (&((ModuleContext *)
                    &(local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start)->v)->module)[uVar34 * 4];
        lVar28 = (long)((intrusive_list_base<wabt::Expr> *)
                       &((ModuleContext *)
                        &(local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)[uVar34 * 2]
                       .next_ - (long)pMVar22 >> 5;
        if (0 < lVar28) {
          lVar28 = lVar28 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr___00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar22)
            ;
            pMVar22 = (Module *)&pMVar22->name;
            lVar28 = lVar28 + -1;
          } while (1 < lVar28);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 < (ulong)(((long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    goto LAB_0015b984;
  case EndReturn:
    local_68 = 0;
    pcStack_60 = "";
LAB_0015b428:
    pcVar24 = "return ";
    sVar21 = 7;
LAB_0015b440:
    postfix_00._M_str._4_4_ = 0;
    postfix_00._0_12_ = ZEXT412(0x1e60b3) << 0x40;
    prefix_00._M_str = pcVar24;
    prefix_00._M_len = sVar21;
    WrapNAry(local_f0,this,&local_138,prefix_00,postfix_00,None);
    goto LAB_0015b984;
  case Decl:
    if (((n->u).var)->type_ != Name) {
LAB_0015cd16:
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3f,"const std::string &wabt::Var::name() const");
    }
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pmVar16->defined = true;
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_0015cd16;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar17 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_118,TVar17);
    plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x1e671c);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar20) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1a8[0]._M_string_length = plVar15[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar15;
    }
    local_1b8._8_8_ = plVar15[1];
    *plVar15 = (long)paVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    uVar29 = local_118.field_2._M_allocated_capacity;
    _Var32._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0015b984;
    goto LAB_0015b97c;
  case DeclInit:
    if (((n->u).var)->type_ != Name) goto LAB_0015cd16;
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pDVar25 = (Decompiler *)
              local_138.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pmVar16->defined == true) {
      pVVar5 = (n->u).var;
      if (pVVar5->type_ != Name) goto LAB_0015cd16;
      name._M_str = (pVVar5->field_2).name_._M_dataplus._M_p;
      name._M_len = (pVVar5->field_2).name_._M_string_length;
      local_168 = VarName(this,name);
      cat<std::basic_string_view<char,std::char_traits<char>>,char[4]>
                ((string *)local_1b8,(wabt *)&local_168,
                 (basic_string_view<char,_std::char_traits<char>_> *)0x1f13bb,(char (*) [4])args_1);
      local_78 = 0;
      pcStack_70 = "";
      uVar27 = 0;
      uVar39 = 0x1e60b3;
      PVar33 = None;
      goto LAB_0015b639;
    }
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_0015cd16;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar17 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_118,TVar17);
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_1b8,(wabt *)"var ",(char (*) [5])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f13bb,
               (char (*) [4])in_R8);
    local_88 = 0;
    pcStack_80 = "";
    postfix_02._M_str._4_4_ = 0;
    postfix_02._0_12_ = ZEXT412(0x1e60b3) << 0x40;
    prefix_02._M_str = (char *)local_1b8._0_8_;
    prefix_02._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pDVar25,prefix_02,postfix_02,None);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    uVar29 = local_118.field_2._M_allocated_capacity;
    _Var32._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0015b984;
    goto LAB_0015b97c;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    if (n->e->type_ != Binary) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_0015cf14:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x48,pcVar24);
    }
    OpcodeToToken_abi_cxx11_((string *)local_1b8,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    iVar14 = std::__cxx11::string::compare((char *)local_1b8);
    PVar33 = Multiply;
    if (((iVar14 != 0) && (iVar14 = std::__cxx11::string::compare(local_1b8), iVar14 != 0)) &&
       (iVar14 = std::__cxx11::string::compare(local_1b8), iVar14 != 0)) {
      iVar14 = std::__cxx11::string::compare(local_1b8);
      PVar33 = Add;
      if ((iVar14 != 0) && (iVar14 = std::__cxx11::string::compare(local_1b8), iVar14 != 0)) {
        iVar14 = std::__cxx11::string::compare(local_1b8);
        PVar33 = Bit;
        if ((iVar14 != 0) &&
           ((iVar14 = std::__cxx11::string::compare(local_1b8), iVar14 != 0 &&
            (iVar14 = std::__cxx11::string::compare(local_1b8), iVar14 != 0)))) {
          iVar14 = std::__cxx11::string::compare(local_1b8);
          if (iVar14 != 0) {
            iVar14 = std::__cxx11::string::compare(local_1b8);
            PVar33 = OtherBin;
            if (iVar14 != 0) goto LAB_0015b79e;
          }
          PVar33 = Shift;
        }
      }
    }
LAB_0015b79e:
    infix._M_str = (char *)local_1b8._0_8_;
    infix._M_len = local_1b8._8_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix,false,PVar33);
    uVar29 = local_1a8[0]._M_dataplus;
    _Var32._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0015b97c;
  case Block:
    pEVar19 = n->e;
    if (pEVar19->type_ != Block) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    name_01._M_str = (char *)pEVar19[1]._vptr_Expr;
    name_01._M_len = (size_t)pEVar19[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_01);
    cat<char[7],std::basic_string_view<char,std::char_traits<char>>,char[2]>
              ((string *)local_1b8,(wabt *)"label ",(char (*) [7])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)":",(char (*) [2])&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if (((((local_140 != (Decompiler *)0x0) && (*(NodeType *)&(local_140->mc).module != Statements))
         && (EVar2 = *(ExprType *)((long)&(local_140->mc).module + 4), EVar2 != Block)) &&
        (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((local_140->mc).label_stack_.super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
         _M_impl.super__Vector_impl_data._M_start == (pointer)n)))) {
      IndentValue(this,child,this->indent_amount,(string_view)ZEXT816(0));
      cVar10._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ModuleContext *)&child->v)->module;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"{","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&child->v,cVar10,(value_type *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
    }
    PVar33 = Atomic;
    *(undefined4 *)
     &(((ModuleContext *)&child->v)->label_stack_).
      super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
      _M_finish = 10;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ModuleContext *)&child->v)->module;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)
                  ->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &((((ModuleContext *)&child->v)->label_stack_).
           super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
           super__Vector_impl_data._M_start)->name;
    ((ModuleContext *)&child->v)->module = (Module *)0x0;
    ((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)->next_ =
         (Expr *)0x0;
    (((ModuleContext *)&child->v)->label_stack_).
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    goto LAB_0015c854;
  case Br:
    pEVar19 = n->e;
    if (pEVar19->type_ != Br) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    if (*(int *)&pEVar19[1].loc.filename._M_str != 1) goto LAB_0015cd16;
    pcVar24 = "goto ";
    if ((n->u).field_0.var_start == 3) {
      pcVar24 = "continue ";
    }
    name_00._M_str = (char *)pEVar19[1].loc.field_1.field_1.offset;
    name_00._M_len = *(size_t *)((long)&pEVar19[1].loc.field_1 + 8);
    sVar38 = VarName(this,name_00);
    y._M_str = (char *)in_R8;
    y._M_len = (size_t)sVar38._M_str;
    operator+[abi_cxx11_((string *)local_1b8,(wabt *)pcVar24,(char *)sVar38._M_len,y);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
    goto LAB_0015b57e;
  case BrIf:
    pEVar19 = n->e;
    if (pEVar19->type_ != BrIf) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    local_118._M_dataplus._M_p = "goto";
    if ((n->u).field_0.var_start == 3) {
      local_118._M_dataplus._M_p = "continue";
    }
    if (*(int *)&pEVar19[1].loc.filename._M_str != 1) goto LAB_0015cd16;
    name_02._M_str = (char *)pEVar19[1].loc.field_1.field_1.offset;
    name_02._M_len = *(size_t *)((long)&pEVar19[1].loc.field_1 + 8);
    local_168 = VarName(this,name_02);
    cat<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
              ((string *)local_1b8,(wabt *)0x1f3d64,(char (*) [3])&local_118,(char **)0x1e61b0,
               (char (*) [2])&local_168,in_R9);
    local_a8 = (pointer)local_1b8._8_8_;
    paStack_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1b8._0_8_;
    postfix_03._M_str._0_4_ = (int)local_1b8._0_8_;
    postfix_03._M_len = local_1b8._8_8_;
    postfix_03._M_str._4_4_ = SUB84(local_1b8._0_8_,4);
    prefix_03._M_str = "if (";
    prefix_03._M_len = 4;
    WrapChild(__return_storage_ptr___00,this,child,prefix_03,postfix_03,None);
    goto LAB_0015b641;
  case BrTable:
    pDVar25 = (Decompiler *)n->e;
    if (*(ExprType *)&pDVar25->target_exp_width != BrTable) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BrTableExpr, Base = wabt::Expr]";
      goto LAB_0015cf14;
    }
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"br_table[","");
    pFVar35 = pDVar25->cur_func;
    pFVar9 = (Func *)pDVar25->cur_ast;
    local_140 = pDVar25;
    if (pFVar35 != pFVar9) {
      do {
        if (*(int *)&pFVar35->decl != 1) goto LAB_0015cd16;
        name_03._M_str = (char *)(pFVar35->decl).type_var.loc.filename._M_len;
        name_03._M_len = (size_t)(pFVar35->decl).type_var.loc.filename._M_str;
        sVar38 = VarName(this,name_03);
        std::__cxx11::string::append(local_1b8,(ulong)sVar38._M_str);
        std::__cxx11::string::append(local_1b8);
        pFVar35 = (Func *)&(pFVar35->decl).type_var.type_;
      } while (pFVar35 != pFVar9);
    }
    std::__cxx11::string::append(local_1b8);
    if (*(int *)((long)&(local_140->lst).vars._M_t._M_impl + 0x28) != 1) goto LAB_0015cd16;
    name_04._M_str = (char *)local_140[1].mc.module;
    name_04._M_len = (size_t)local_140[1].mc.current_func_;
    sVar38 = VarName(this,name_04);
    std::__cxx11::string::append(local_1b8,(ulong)sVar38._M_str);
    std::__cxx11::string::append(local_1b8);
    local_d8 = 1;
    pcStack_d0 = ")";
    uVar27 = 1;
    uVar39 = 0x1e851f;
    PVar33 = Atomic;
    pDVar25 = (Decompiler *)
              local_138.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_0015b639:
    postfix_01._M_str._0_4_ = uVar39;
    postfix_01._M_len = (ulong)uVar27;
    postfix_01._M_str._4_4_ = 0;
    prefix_01._M_str = (char *)local_1b8._0_8_;
    prefix_01._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pDVar25,prefix_01,postfix_01,PVar33);
    goto LAB_0015b641;
  default:
    local_1b8._0_8_ = local_1a8;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    if ((int)EVar2 < 0x1c) {
      if (EVar2 != Call) {
        if (EVar2 != CallIndirect) {
          if (EVar2 == Convert) {
            pEVar19 = n->e;
            if (pEVar19->type_ != Convert) {
              pcVar24 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Convert>, Base = wabt::Expr]"
              ;
              goto LAB_0015cf14;
            }
            goto LAB_0015cb3b;
          }
          goto switchD_0015c362_caseD_1d;
        }
        pcVar24 = "call_indirect";
        goto LAB_0015cc82;
      }
      if (n->e->type_ != Call) {
        pcVar24 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Call>, Base = wabt::Expr]"
        ;
        goto LAB_0015cf14;
      }
      if (*(int *)&n->e[1].loc.filename._M_str != 1) goto LAB_0015cd16;
      std::__cxx11::string::_M_assign((string *)local_1b8);
    }
    else {
      switch(EVar2) {
      case MemoryCopy:
        pcVar24 = "memory_copy";
        break;
      case MemoryFill:
        pcVar24 = "memory_fill";
        break;
      case MemoryGrow:
        pcVar24 = "memory_grow";
        break;
      case MemorySize:
        pcVar24 = "memory_size";
        break;
      case RefIsNull:
        pcVar24 = "is_null";
        break;
      case ReturnCall:
        pEVar19 = n->e;
        if (pEVar19->type_ != ReturnCall) {
          pcVar24 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::ReturnCall>, Base = wabt::Expr]"
          ;
          goto LAB_0015cf14;
        }
        if (*(int *)&pEVar19[1].loc.filename._M_str != 1) goto LAB_0015cd16;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_168,"return_call ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar19[1].loc.field_1.field_0);
        std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_len != &local_158) {
          operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
        }
        PVar33 = None;
        goto LAB_0015cc8c;
      case ReturnCallIndirect:
        pcVar24 = "return_call call_indirect";
        break;
      case Select:
        pcVar24 = "select_if";
        break;
      default:
        if (EVar2 == Ternary) {
          pEVar19 = n->e;
          if (pEVar19->type_ != Ternary) {
            pcVar24 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Ternary>, Base = wabt::Expr]"
            ;
            goto LAB_0015cf14;
          }
LAB_0015cb3b:
          OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&pEVar19->field_0x3c);
          std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_len != &local_158) {
            operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
          }
          goto LAB_0015cc87;
        }
      case DataDrop:
      case MemoryInit:
      case Nop:
      case RefFunc:
      case RefNull:
      case Rethrow:
      case Return:
switchD_0015c362_caseD_1d:
        pcVar24 = GetExprTypeName(EVar2);
      }
LAB_0015cc82:
      std::__cxx11::string::operator=((string *)local_1b8,pcVar24);
    }
LAB_0015cc87:
    PVar33 = Atomic;
LAB_0015cc8c:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "(");
    local_e8 = 1;
    pcStack_e0 = ")";
    postfix_04._M_str._0_4_ = 0x1e851f;
    postfix_04._M_len = 1;
    postfix_04._M_str._4_4_ = 0;
    prefix_05._M_str = (char *)local_168._M_len;
    prefix_05._M_len = (size_t)local_168._M_str;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix_05,postfix_04,PVar33);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
LAB_0015ccf6:
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
LAB_0015cd03:
    uVar29 = local_1a8[0]._M_dataplus;
    _Var32._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0015b97c;
  case CodeMetadata:
    pEVar19 = n->e;
    if (pEVar19->type_ != CodeMetadata) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::CodeMetadataExpr, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    y_00._M_str = (char *)in_R8;
    y_00._M_len = (size_t)pEVar19[1].super_intrusive_list_base<wabt::Expr>.next_;
    operator+[abi_cxx11_
              ((string *)&local_168,(wabt *)"// @metadata.code.",(char *)pEVar19[1]._vptr_Expr,y_00)
    ;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 == paVar20) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1a8[0]._M_string_length = puVar18[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar18;
    }
    local_1b8._8_8_ = puVar18[1];
    *puVar18 = paVar20;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    BinaryToString_abi_cxx11_
              ((string *)&local_168,this,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &pEVar19[1].super_intrusive_list_base<wabt::Expr>.prev_);
    std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      local_158._8_8_ = local_1a8[0]._M_string_length;
      local_1b8._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
    local_168._M_str = (char *)local_1b8._8_8_;
    local_168._M_len = local_1b8._0_8_;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    goto LAB_0015c58f;
  case Compare:
    if (n->e->type_ != Compare) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Compare>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    OpcodeToToken_abi_cxx11_((string *)local_1b8,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    infix_01._M_str = (char *)local_1b8._0_8_;
    infix_01._M_len = local_1b8._8_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_01,false,Equal);
LAB_0015b641:
    uVar29 = local_1a8[0]._M_dataplus;
    _Var32._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
LAB_0015b97c:
      operator_delete(_Var32._M_p,uVar29 + 1);
    }
    break;
  case Const:
    pEVar19 = n->e;
    if (pEVar19->type_ != Const) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
      goto LAB_0015cf14;
    }
    switch(*(undefined4 *)&pEVar19[1].loc.filename._M_str) {
    case 0xfffffffb:
      pcVar30 = "V128";
      pcVar24 = "";
      goto LAB_0015b9bd;
    case 0xfffffffc:
      to_string_abi_cxx11_((string *)local_1b8,this,*(double *)((long)&pEVar19[1].loc.field_1 + 8));
      goto LAB_0015b542;
    case 0xfffffffd:
      to_string_abi_cxx11_
                ((string *)&local_168,this,(double)*(float *)((long)&pEVar19[1].loc.field_1 + 8));
      break;
    case 0xfffffffe:
      std::__cxx11::to_string((string *)&local_168,*(long *)((long)&pEVar19[1].loc.field_1 + 8));
      break;
    case 0xffffffff:
      std::__cxx11::to_string((string *)local_1b8,pEVar19[1].loc.field_1.field_0.last_column);
      local_168 = (string_view)ZEXT816(0);
      local_158._M_allocated_capacity._0_4_ = Any;
      local_158._M_allocated_capacity._4_4_ = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
                 (string *)local_1b8,&local_1a8[0].field_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr___00->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_168);
      __return_storage_ptr___00->precedence = Atomic;
      goto LAB_0015b57e;
    default:
      abort();
    }
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 == paVar20) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1a8[0]._M_string_length = puVar18[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar18;
    }
    local_1b8._8_8_ = puVar18[1];
    *puVar18 = paVar20;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = Atomic;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
LAB_0015c446:
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    goto LAB_0015c453;
  case Drop:
    goto switchD_0015b67f_caseD_13;
  case GlobalGet:
    if ((((VarExpr<(wabt::ExprType)20> *)n->e)->super_ExprMixin<(wabt::ExprType)20>).super_Expr.
        type_ != GlobalGet) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalGet>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    Get<(wabt::ExprType)20>(local_f0,this,(VarExpr<(wabt::ExprType)20> *)n->e);
    break;
  case GlobalSet:
    if ((((VarExpr<(wabt::ExprType)21> *)n->e)->super_ExprMixin<(wabt::ExprType)21>).super_Expr.
        type_ != GlobalSet) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalSet>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    Set<(wabt::ExprType)21>
              (local_f0,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)21> *)n->e);
    break;
  case If:
    if (n->e->type_ != If) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
      goto LAB_0015cf14;
    }
    sVar21 = n->e[4].loc.field_1.field_1.offset;
    val = (Value *)((long)local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x40);
    if (sVar21 == 0) {
      val = (Value *)0x0;
    }
    pMVar22 = ((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->module;
    pMVar8 = (Module *)
             ((intrusive_list_base<wabt::Expr> *)
             &((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_;
    bVar37 = true;
    if ((ulong)((long)pMVar8 - (long)pMVar22) < 0x21) {
      bVar37 = 0x20 < (ulong)((long)((anon_union_8_3_69560e6a_for_u *)
                                    &(((anon_union_16_2_ecfd7102_for_Location_1 *)
                                      ((long)local_138.
                                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 0x28))->
                                     field_1).offset)->var -
                             (long)(((ModuleContext *)
                                    &(local_138.
                                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
                                   super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pEVar19 = (Expr *)0x0;
    for (; pMVar22 != pMVar8; pMVar22 = (Module *)&pMVar22->name) {
      pEVar23 = ((intrusive_list_base<wabt::Expr> *)&(pMVar22->loc).filename._M_str)->next_;
      if (pEVar19 <= pEVar23) {
        pEVar19 = pEVar23;
      }
    }
    pEVar23 = (Expr *)0x0;
    for (pLVar31 = (((ModuleContext *)
                    &(local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
                   super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pLVar31 !=
        (pointer)((anon_union_8_3_69560e6a_for_u *)
                 &(((anon_union_16_2_ecfd7102_for_Location_1 *)
                   ((long)local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x28))->field_1).offset)->var;
        pLVar31 = (pointer)&pLVar31->label_type) {
      in_R8 = (Expr *)(pLVar31->name)._M_string_length;
      if (pEVar23 <= in_R8) {
        pEVar23 = in_R8;
      }
    }
    uVar34 = (long)&pEVar23->_vptr_Expr + (long)pEVar19;
    if (sVar21 != 0) {
      pbVar11 = (val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar26 = 0;
      pbVar36 = (val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar13 = pbVar36;
      while (pbVar13 != pbVar11) {
        if (uVar26 <= pbVar13->_M_string_length) {
          uVar26 = pbVar13->_M_string_length;
        }
        pbVar13 = pbVar13 + 1;
        in_R8 = (Expr *)pbVar13;
      }
      uVar34 = uVar26 + uVar34;
      if (bVar37) {
        bVar37 = true;
      }
      else {
        bVar37 = 0x20 < (ulong)((long)pbVar11 - (long)pbVar36);
      }
    }
    if ((bVar37) || (this->target_exp_width < uVar34)) {
      pMVar12 = (ModuleContext *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->v;
      first_indent._M_str = "if (";
      first_indent._M_len = 4;
      IndentValue(this,local_138.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start,4,first_indent);
      std::__cxx11::string::append
                ((char *)&((intrusive_list_base<wabt::Expr> *)
                          &((ModuleContext *)&child->v)->current_func_)->next_[-1].loc.filename.
                          _M_str);
      local_140 = this;
      IndentValue(this,(Value *)&(pMVar12->label_stack_).
                                 super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                  this->indent_amount,(string_view)ZEXT816(0));
      pLVar31 = (((ModuleContext *)&child->v)->label_stack_).
                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      lVar28 = (long)((anon_union_8_3_69560e6a_for_u *)
                     &(((anon_union_16_2_ecfd7102_for_Location_1 *)((long)child + 0x28))->field_1).
                      offset)->var - (long)pLVar31 >> 5;
      if (0 < lVar28) {
        lVar28 = lVar28 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                     &pLVar31->name);
          pLVar31 = (pointer)&pLVar31->label_type;
          lVar28 = lVar28 + -1;
        } while (1 < lVar28);
      }
      if (sVar21 != 0) {
        local_1b8._0_8_ = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"} else {","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
            local_1a8) {
          operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
        }
        IndentValue(local_140,val,local_140->indent_amount,(string_view)ZEXT816(0));
        pbVar36 = (val->v).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar28 = (long)(val->v).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar36 >> 5;
        if (0 < lVar28) {
          lVar28 = lVar28 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                       pbVar36);
            pbVar36 = pbVar36 + 1;
            lVar28 = lVar28 + -1;
          } while (1 < lVar28);
        }
      }
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
      PVar33 = If;
      goto LAB_0015c82b;
    }
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_1b8,(wabt *)"if (",
               (char (*) [5])
               ((ModuleContext *)
               &(local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start)->v)->module,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") {",
               (char (*) [4])in_R8);
    pLVar31 = (((ModuleContext *)&child->v)->label_stack_).
              super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (pLVar31 !=
        (pointer)((anon_union_8_3_69560e6a_for_u *)
                 &(((anon_union_16_2_ecfd7102_for_Location_1 *)((long)child + 0x28))->field_1).
                  offset)->var) {
      cat<char[2],std::__cxx11::string,char[2]>
                ((string *)&local_168,(wabt *)0x1e61b0,(char (*) [2])pLVar31,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e61b0,
                 (char (*) [2])in_R8);
      std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_len != &local_158) {
        operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append(local_1b8);
    if (sVar21 != 0) {
      cat<char[9],std::__cxx11::string,char[3]>
                ((string *)&local_168,(wabt *)" else { ",
                 (char (*) [9])
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f1da5,
                 (char (*) [3])in_R8);
      std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_len != &local_158) {
        operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      local_158._8_8_ = local_1a8[0]._M_string_length;
      local_1b8._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
    local_168._M_str = (char *)local_1b8._8_8_;
    local_168._M_len = local_1b8._0_8_;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = If;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) goto LAB_0015ccf6;
    goto LAB_0015cd03;
  case Load:
    pEVar19 = n->e;
    if (pEVar19->type_ != Load) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Load>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    local_140 = (Decompiler *)
                local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_120 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar7 = pEVar19[2].loc.filename._M_len;
    OVar3.enum_ = *(Enum *)&pEVar19[2].super_intrusive_list_base<wabt::Expr>.next_;
    pEVar23 = pEVar19[2].super_intrusive_list_base<wabt::Expr>.prev_;
    Opcode::GetInfo((Info *)local_1b8,(Opcode *)&pEVar19[2].super_intrusive_list_base<wabt::Expr>);
    LoadStore(this,(Value *)local_140,local_120,uVar7,OVar3,(Address)pEVar23,
              (Type)local_1a8[0]._M_dataplus._M_p);
    goto switchD_0015b67f_caseD_13;
  case LocalGet:
    if ((((VarExpr<(wabt::ExprType)24> *)n->e)->super_ExprMixin<(wabt::ExprType)24>).super_Expr.
        type_ != LocalGet) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    Get<(wabt::ExprType)24>(local_f0,this,(VarExpr<(wabt::ExprType)24> *)n->e);
    break;
  case LocalSet:
    if ((((VarExpr<(wabt::ExprType)25> *)n->e)->super_ExprMixin<(wabt::ExprType)25>).super_Expr.
        type_ != LocalSet) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalSet>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    Set<(wabt::ExprType)25>
              (local_f0,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)25> *)n->e);
    break;
  case LocalTee:
    ve = (VarExpr<(wabt::ExprType)26> *)n->e;
    if ((ve->super_ExprMixin<(wabt::ExprType)26>).super_Expr.type_ != LocalTee) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    if (local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)26>(local_f0,this,ve);
    }
    else {
      Set<(wabt::ExprType)26>
                (local_f0,this,
                 local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve);
    }
    break;
  case Loop:
    pEVar19 = n->e;
    if (pEVar19->type_ != Loop) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    IndentValue(this,local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start,this->indent_amount,
                (string_view)ZEXT816(0));
    cVar10._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ModuleContext *)&child->v)->module;
    name_05._M_str = (char *)pEVar19[1]._vptr_Expr;
    name_05._M_len = (size_t)pEVar19[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_05);
    cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
              ((string *)local_1b8,(wabt *)"loop ",(char (*) [6])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)0x1e33e0,(char (*) [3])&local_168
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,cVar10,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    PVar33 = Atomic;
LAB_0015c82b:
    *(Precedence *)
     &(((ModuleContext *)&child->v)->label_stack_).
      super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
      _M_finish = PVar33;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ModuleContext *)&child->v)->module;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)
                  ->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &((((ModuleContext *)&child->v)->label_stack_).
           super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
           super__Vector_impl_data._M_start)->name;
    ((ModuleContext *)&child->v)->module = (Module *)0x0;
    ((intrusive_list_base<wabt::Expr> *)&((ModuleContext *)&child->v)->current_func_)->next_ =
         (Expr *)0x0;
    (((ModuleContext *)&child->v)->label_stack_).
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
LAB_0015c854:
    __return_storage_ptr___00->precedence = PVar33;
    break;
  case Nop:
    pcVar30 = "nop";
    pcVar24 = "";
    goto LAB_0015c1cc;
  case RefNull:
    pcVar30 = "null";
    pcVar24 = "";
LAB_0015b9bd:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar30,pcVar24);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
    goto LAB_0015c212;
  case Rethrow:
    local_c8 = 0;
    pcStack_c0 = "";
    pcVar24 = "rethrow ";
    sVar21 = 8;
    goto LAB_0015b440;
  case Return:
    local_b8 = 0;
    pcStack_b0 = "";
    goto LAB_0015b428;
  case Store:
    pEVar19 = n->e;
    if (pEVar19->type_ != Store) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Store>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    local_140 = (Decompiler *)
                local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_120 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar7 = pEVar19[2].loc.filename._M_len;
    OVar3.enum_ = *(Enum *)&pEVar19[2].super_intrusive_list_base<wabt::Expr>.next_;
    pEVar23 = pEVar19[2].super_intrusive_list_base<wabt::Expr>.prev_;
    Opcode::GetInfo((Info *)local_1b8,(Opcode *)&pEVar19[2].super_intrusive_list_base<wabt::Expr>);
    LoadStore(this,(Value *)local_140,local_120,uVar7,OVar3,(Address)pEVar23,
              (Type)local_1a8[0].field_2._0_8_);
    infix_00._M_str = "=";
    infix_00._M_len = 1;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_00,true,Assign);
    break;
  case Unary:
    if (n->e->type_ != Unary) {
      pcVar24 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Unary>, Base = wabt::Expr]"
      ;
      goto LAB_0015cf14;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_168);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar20) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1a8[0]._M_string_length = plVar15[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar20->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar15;
    }
    local_1b8._8_8_ = plVar15[1];
    *plVar15 = (long)paVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    local_98 = 1;
    pcStack_90 = ")";
    sVar38._M_str._0_4_ = 0x1e851f;
    sVar38._M_len = 1;
    sVar38._M_str._4_4_ = 0;
    prefix_04._M_str = (char *)local_1b8._0_8_;
    prefix_04._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,child,prefix_04,sVar38,Atomic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) goto LAB_0015c446;
LAB_0015c453:
    uVar29 = local_158._M_allocated_capacity;
    _Var32._M_p = (pointer)local_168._M_len;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len == &local_158) break;
    goto LAB_0015b97c;
  case Last:
    pcVar30 = "unreachable";
    pcVar24 = "";
LAB_0015c1cc:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar30,pcVar24);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
LAB_0015c212:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
LAB_0015c58f:
    uVar29 = local_1a8[0]._M_dataplus;
    _Var32._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0015b97c;
  }
LAB_0015b984:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            (&local_138);
  return __return_storage_ptr___00;
switchD_0015b67f_caseD_13:
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ModuleContext *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->v)->module;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((intrusive_list_base<wabt::Expr> *)
                &((ModuleContext *)
                 &(local_138.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       &((((ModuleContext *)
          &(local_138.
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
            _M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
         super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
         super__Vector_impl_data._M_start)->name;
  ((ModuleContext *)
  &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
    _M_impl.super__Vector_impl_data._M_start)->v)->module = (Module *)0x0;
  ((intrusive_list_base<wabt::Expr> *)
  &((ModuleContext *)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v)->current_func_)->next_ = (Expr *)0x0;
  (((ModuleContext *)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  PVar33 = *(Precedence *)
            &(((ModuleContext *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->v)->label_stack_).
             super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
             super__Vector_impl_data._M_finish;
  goto LAB_0015c854;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) {
            decls += ", ";
          }
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value{{TempVarName(n.u.var_start)}, Precedence::Atomic};
      }
      case NodeType::Statements: {
        Value stats{{}, Precedence::None};
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') {
            s += ';';
          }
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{{"var " + LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var))},
                     Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(args[0],
                           cat("var ",
                               LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var)),
                               " = "),
                           "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, opcs, false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
        return WrapBinary(args, OpcodeToToken(ce.opcode), false,
                          Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        // BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, "=", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value* elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = std::string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(),
                      std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") {");
          if (!thenp.v.empty())
            s += cat(" ", thenp.v[0], " ");
          s += "}";
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
            cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements &&
            parent->etype != ExprType::Block &&
            parent->etype != ExprType::Loop &&
            (parent->etype != ExprType::If || &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (",
                         cat(") ", jmp, " ", VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto& v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      case ExprType::CodeMetadata: {
        auto cme = cast<CodeMetadataExpr>(n.e);
        std::string c = "// @metadata.code." + cme->name + " ";
        c += BinaryToString(cme->data);
        return Value{{std::move(c)}, Precedence::None};
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }